

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void disableRawMouseMotion(_GLFWwindow *window)

{
  uchar mask [1];
  XIEventMask em;
  
  em.mask = mask;
  mask[0] = '\0';
  em.deviceid = 1;
  em.mask_len = 1;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&em,1);
  return;
}

Assistant:

static void disableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}